

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<Qt::ArrowType,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QDebug local_28;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QDebug)dbg->stream;
  *(int *)(local_28.stream + 0x28) = *(int *)(local_28.stream + 0x28) + 1;
  qt_QMetaEnum_debugOperator
            (&local_20,(longlong)&local_28,(QMetaObject *)(ulong)*a,(char *)&Qt::staticMetaObject);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }